

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi_lmo_parallel1.cpp
# Opt level: O0

int256_t * primesum::pi_lmo_parallel1(int128_t x,int threads)

{
  undefined1 x_00 [16];
  undefined1 x_01 [16];
  undefined1 x_02 [16];
  undefined1 x_03 [16];
  int256_t *this;
  undefined4 in_ECX;
  long in_RDX;
  int256_t *extraout_RDX;
  ulong in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int256_t phi;
  int256_t s2;
  int256_t s1;
  vector<int,_std::allocator<int>_> primes;
  vector<int,_std::allocator<int>_> lpf;
  vector<int,_std::allocator<int>_> mu;
  int256_t p2;
  vector<int,_std::allocator<int>_> *in_stack_000001c0;
  vector<int,_std::allocator<int>_> *in_stack_000001c8;
  int in_stack_000001d0;
  int64_t c;
  int64_t z;
  int64_t y;
  int64_t x13;
  double alpha;
  int64_t in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd3c;
  int256_t *in_stack_fffffffffffffd40;
  int256_t *this_00;
  undefined8 in_stack_fffffffffffffd48;
  int iVar1;
  allocator<char> *alpha_00;
  allocator<char> *c_00;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined8 in_stack_fffffffffffffd78;
  undefined8 in_stack_fffffffffffffd90;
  int64_t in_stack_fffffffffffffd98;
  int64_t in_stack_fffffffffffffda8;
  allocator<char> local_111;
  string local_110 [4];
  int in_stack_fffffffffffffef4;
  int64_t in_stack_fffffffffffffef8;
  undefined1 in_stack_ffffffffffffff00 [16];
  allocator<char> local_e9;
  string local_e8 [20];
  int in_stack_ffffffffffffff2c;
  int64_t in_stack_ffffffffffffff30;
  int64_t in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff40 [16];
  string local_b0 [32];
  int64_t local_90;
  undefined8 local_88;
  long local_80;
  __int128 *local_78;
  ulong local_68;
  long local_60;
  __int128 *local_50;
  double local_38;
  undefined4 local_2c;
  ulong local_28;
  long local_20;
  
  iVar1 = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
  if (-in_RDX < (long)(ulong)(1 < in_RSI)) {
    x_02._8_8_ = in_stack_fffffffffffffd98;
    x_02._0_8_ = in_stack_fffffffffffffd90;
    this_01 = in_RDI;
    local_2c = in_ECX;
    local_28 = in_RSI;
    local_20 = in_RDX;
    local_38 = get_alpha_lmo((int128_t)x_02);
    local_60 = local_20;
    local_68 = local_28;
    x_03._8_8_ = in_stack_fffffffffffffd98;
    x_03._0_8_ = in_stack_fffffffffffffd90;
    local_78 = iroot<3,__int128>((__int128)x_03);
    local_80 = (long)((double)(long)local_78 * local_38);
    local_50 = local_78;
    local_88 = __divti3(local_28,local_20,local_80,local_80 >> 0x3f);
    local_90 = PhiTiny::get_c(in_stack_fffffffffffffd28);
    __a = (allocator<char> *)&stack0xffffffffffffff4f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)in_RDI,__a);
    print((string *)0x14729c);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff4f);
    c_00 = &local_e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)in_RDI,__a);
    print((string *)0x1472f2);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator(&local_e9);
    alpha_00 = &local_111;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)in_RDI,__a);
    print((string *)0x147348);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator(&local_111);
    x_00._8_8_ = in_stack_fffffffffffffd78;
    x_00._0_8_ = this_01;
    print((int128_t)x_00,(int64_t)in_RDI,(int64_t)__a,(int64_t)c_00,(double)alpha_00,iVar1);
    P2((int128_t)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
    generate_moebius(in_stack_fffffffffffffd98);
    generate_lpf(in_stack_fffffffffffffd98);
    generate_primes((int64_t)in_RDI);
    iVar1 = (int)((ulong)in_RDI >> 0x20);
    S1((int128_t)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
       in_stack_ffffffffffffff2c);
    anon_unknown.dwarf_cb25c::S2
              ((uint128_t)stack0x00000160,
               (int64_t)lpf.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish,
               (int64_t)lpf.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
               (vector<int,_std::allocator<int>_> *)
               primes.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage,in_stack_000001c0,in_stack_000001c8,in_stack_000001d0);
    int256_t::operator+(in_stack_fffffffffffffd40,
                        (int256_t *)CONCAT44(in_stack_fffffffffffffd3c,local_2c));
    this = (int256_t *)prime_sum_tiny(in_stack_fffffffffffffda8);
    x_01._8_8_ = this;
    x_01._0_8_ = this_01;
    this_00 = extraout_RDX;
    int256_t::operator+(this,(__int128)x_01);
    int256_t::operator-((int256_t *)this_01,iVar1);
    int256_t::operator-(this_00,(int256_t *)CONCAT44(in_stack_fffffffffffffd3c,local_2c));
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  }
  else {
    int256_t::int256_t<int,void>((int256_t *)in_RDI,0);
    this_01 = in_RDI;
  }
  return (int256_t *)this_01;
}

Assistant:

int256_t pi_lmo_parallel1(int128_t x, int threads)
{
  if (x < 2)
    return 0;

  double alpha = get_alpha_lmo(x);
  int64_t x13 = iroot<3>(x);
  int64_t y = (int64_t) (x13 * alpha);
  int64_t z = x / y;
  int64_t c = PhiTiny::get_c(y);

  print("");
  print("=== pi_lmo_parallel1(x) ===");
  print("pi(x) = S1 + S2 + pi(y) - 1 - P2");
  print(x, y, z, c, alpha, threads);

  int256_t p2 = P2(x, y, threads);
  vector<int32_t> mu = generate_moebius(y);
  vector<int32_t> lpf = generate_lpf(y);
  vector<int32_t> primes = generate_primes(y);

  int256_t s1 = S1(x, y, c, threads);
  int256_t s2 = S2(x, y, c, primes, lpf, mu, threads);
  int256_t phi = s1 + s2;
  int256_t sum = phi + prime_sum_tiny(y) - 1 - p2;

  return sum;
}